

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_jpeg.h
# Opt level: O1

int tje_encode_to_file_at_quality
              (char *dest_path,int quality,int width,int height,int num_components,uchar *src_data)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  
  __stream = fopen(dest_path,"wb");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = tje_encode_with_func
                      (tjei_stdlib_func,__stream,quality,width,height,num_components,src_data);
    iVar2 = fclose(__stream);
    uVar1 = iVar2 == 0 | uVar1;
  }
  return uVar1;
}

Assistant:

int tje_encode_to_file_at_quality(const char* dest_path,
                                  const int quality,
                                  const int width,
                                  const int height,
                                  const int num_components,
                                  const unsigned char* src_data)
{
    FILE* fd = fopen(dest_path, "wb");
    if (!fd) {
        tje_log("Could not open file for writing.");
        return 0;
    }

    int result = tje_encode_with_func(tjei_stdlib_func, fd,
                                      quality, width, height, num_components, src_data);

    result |= 0 == fclose(fd);

    return result;
}